

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O2

void __thiscall QTextDocumentPrivate::compressPieceTable(QTextDocumentPrivate *this)

{
  uint uVar1;
  Data *pDVar2;
  QTextFragmentData *pQVar3;
  undefined8 uVar4;
  QChar *__dest;
  char16_t *pcVar5;
  int iVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_68;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->undoEnabled == false) && (0xc000 < this->unreachableCharacterCount)) {
    pDVar2 = (this->text).d.d;
    if ((pDVar2 == (Data *)0x0) ||
       ((double)(pDVar2->super_QArrayData).alloc * 0.9 <= (double)(this->text).d.size)) {
      local_68.d = (Data *)0x0;
      local_68.ptr = (char16_t *)0x0;
      local_68.size = 0;
      QString::resize((longlong)&local_68);
      __dest = QString::data((QString *)&local_68);
      local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QFragmentMap<QTextFragmentData>::begin((QFragmentMap<QTextFragmentData> *)local_48);
      iVar6 = 0;
      while (uVar4 = local_48._0_8_, uVar7 = local_48._8_8_ & 0xffffffff, uVar7 != 0) {
        pcVar5 = (this->text).d.ptr;
        if (pcVar5 == (char16_t *)0x0) {
          pcVar5 = (char16_t *)&QString::_empty;
        }
        pQVar3 = (((QFragmentMapData<QTextFragmentData> *)local_48._0_8_)->field_0).fragments;
        memcpy(__dest,pcVar5 + pQVar3[uVar7].stringPosition,
               (ulong)pQVar3[uVar7].super_QFragment<1>.size_array[0] * 2);
        (((QFragmentMapData<QTextFragmentData> *)uVar4)->field_0).fragments[uVar7].stringPosition =
             iVar6;
        uVar1 = (((QFragmentMapData<QTextFragmentData> *)uVar4)->field_0).fragments[uVar7].
                super_QFragment<1>.size_array[0];
        __dest = __dest + uVar1;
        iVar6 = iVar6 + uVar1;
        QFragmentMap<QTextFragmentData>::Iterator::operator++((Iterator *)local_48);
      }
      QString::resize((longlong)&local_68);
      QString::squeeze((QString *)&local_68);
      QString::operator=(&this->text,(QString *)&local_68);
      this->unreachableCharacterCount = 0;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocumentPrivate::compressPieceTable()
{
    if (undoEnabled)
        return;

    const uint garbageCollectionThreshold = 96 * 1024; // bytes

    //qDebug() << "unreachable bytes:" << unreachableCharacterCount * sizeof(QChar) << " -- limit" << garbageCollectionThreshold << "text size =" << text.size() << "capacity:" << text.capacity();

    bool compressTable = unreachableCharacterCount * sizeof(QChar) > garbageCollectionThreshold
                         && text.size() >= text.capacity() * 0.9;
    if (!compressTable)
        return;

    QString newText;
    newText.resize(text.size());
    QChar *newTextPtr = newText.data();
    int newLen = 0;

    for (FragmentMap::Iterator it = fragments.begin(); !it.atEnd(); ++it) {
        memcpy(newTextPtr, text.constData() + it->stringPosition, it->size_array[0] * sizeof(QChar));
        it->stringPosition = newLen;
        newTextPtr += it->size_array[0];
        newLen += it->size_array[0];
    }

    newText.resize(newLen);
    newText.squeeze();
    //qDebug() << "removed" << text.size() - newText.size() << "characters";
    text = newText;
    unreachableCharacterCount = 0;
}